

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

void __thiscall
mprpc::MpRpcServer::on_recv
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,char *data,size_t size)

{
  undefined8 *puVar1;
  bool bVar2;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  mapped_type *this_00;
  long lVar6;
  undefined1 local_148 [8];
  MsgPackPacker pk;
  string local_118 [32];
  shared_ptr<mprpc::MpRpcMessage> local_f8;
  shared_ptr<mprpc::ClientConnection> local_e8;
  shared_ptr<mprpc::MpRpcMessage> local_d8;
  shared_ptr<mprpc::ClientConnection> local_c8;
  rep local_b8;
  key_type local_b0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
  local_90;
  key_type local_88 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
  local_68;
  iterator it;
  undefined1 local_50 [8];
  unique_lock<std::recursive_mutex> lock;
  undefined1 local_38 [8];
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  size_t size_local;
  char *data_local;
  shared_ptr<mprpc::ClientConnection> *conn_local;
  MpRpcServer *this_local;
  
  rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
  MpRpcMessage::parse((MpRpcMessage *)local_38,data,size);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if ((bVar2) &&
     (peVar3 = std::
               __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38), peVar3->id != 0)) {
    std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )local_38);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::unique_lock<std::recursive_mutex>::unique_lock
                ((unique_lock<std::recursive_mutex> *)local_50,(mutex_type *)(this + 8));
      peVar5 = std::
               __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)conn);
      (**(code **)(*(long *)peVar5 + 0x10))(local_88);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                   *)(this + 0x30),local_88);
      std::__cxx11::string::~string((string *)local_88);
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                  *)(this + 0x30));
      bVar2 = std::__detail::operator==(&local_68,&local_90);
      if (bVar2) {
        peVar5 = std::
                 __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)conn);
        (**(code **)(*(long *)peVar5 + 0x10))(local_b0);
        this_00 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                                *)(this + 0x30),local_b0);
        std::shared_ptr<mprpc::ClientConnection>::operator=(this_00,conn);
        std::__cxx11::string::~string((string *)local_b0);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_50);
      local_b8 = std::chrono::_V2::system_clock::now();
      peVar3 = std::
               __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      (peVar3->recv_time).__d.__r = local_b8;
      std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_38);
      lVar6 = std::__cxx11::string::size();
      if (lVar6 == 0) {
        MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_148);
        MsgPackPacker::pack_map((MsgPackPacker *)local_148,2);
        peVar3 = std::
                 __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        MsgPackPacker::pack_map_item((MsgPackPacker *)local_148,"id",peVar3->id);
        MsgPackPacker::pack_string((MsgPackPacker *)local_148,"error",0);
        MsgPackPacker::pack_map((MsgPackPacker *)local_148,2);
        MsgPackPacker::pack_map_item((MsgPackPacker *)local_148,"code",-1);
        MsgPackPacker::pack_map_item((MsgPackPacker *)local_148,"message","empty method");
        peVar5 = std::
                 __shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)conn);
        (**(code **)(*(long *)peVar5 + 0x20))(peVar5,pk.sb.size,local_148);
        MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_148);
      }
      else if (*(long *)this == 0) {
        std::shared_ptr<mprpc::ClientConnection>::shared_ptr(&local_e8,conn);
        std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
                  (&local_f8,(shared_ptr<mprpc::MpRpcMessage> *)local_38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_118,"unknown method",(allocator *)((long)&pk.pk.callback + 7));
        send_error_rsp(this,&local_e8,&local_f8,-1,(string *)local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pk.pk.callback + 7));
        std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr(&local_f8);
        std::shared_ptr<mprpc::ClientConnection>::~shared_ptr(&local_e8);
      }
      else {
        puVar1 = *(undefined8 **)this;
        std::shared_ptr<mprpc::ClientConnection>::shared_ptr(&local_c8,conn);
        std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
                  (&local_d8,(shared_ptr<mprpc::MpRpcMessage> *)local_38);
        (**(code **)*puVar1)(puVar1,&local_c8,&local_d8);
        std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr(&local_d8);
        std::shared_ptr<mprpc::ClientConnection>::~shared_ptr(&local_c8);
      }
      lock._12_4_ = 0;
      goto LAB_001cb519;
    }
  }
  lock._12_4_ = 1;
LAB_001cb519:
  std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr((shared_ptr<mprpc::MpRpcMessage> *)local_38);
  return;
}

Assistant:

void MpRpcServer::on_recv(shared_ptr<ClientConnection> conn, const char* data, size_t size)
    {
        auto rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg ||
            rpcmsg->id == 0 ||
            rpcmsg->method.empty())
        {
            return;
        }

        {
            unique_lock<recursive_mutex> lock(m_conn_map_lock);
            auto it = m_conn_map.find(conn->id());
            if (it == m_conn_map.end()) m_conn_map[conn->id()] = conn;
        }

        rpcmsg->recv_time = system_clock::now();

        if (rpcmsg->method.size()) {
            if (m_callback)
                m_callback->on_call(conn, rpcmsg);
            else {
                send_error_rsp(conn, rpcmsg, -1, "unknown method");
            }
        }
        else {
            MsgPackPacker pk;
            pk.pack_map(2);
            pk.pack_map_item ("id", rpcmsg->id);
            pk.pack_string   ("error");
            // error -> [ code, message]
            pk.pack_map(2);
            pk.pack_map_item ("code", -1);
            pk.pack_map_item ("message", "empty method");

            conn->send(pk.sb.data, pk.sb.size);
        }
    }